

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QShader::SeparateToCombinedImageSamplerMapping>::copyAppend
          (QGenericArrayOps<QShader::SeparateToCombinedImageSamplerMapping> *this,
          SeparateToCombinedImageSamplerMapping *b,SeparateToCombinedImageSamplerMapping *e)

{
  SeparateToCombinedImageSamplerMapping *pSVar1;
  Data *pDVar2;
  int iVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size;
    do {
      pDVar2 = (b->combinedSamplerName).d.d;
      pSVar1[lVar4].combinedSamplerName.d.d = pDVar2;
      pSVar1[lVar4].combinedSamplerName.d.ptr = (b->combinedSamplerName).d.ptr;
      pSVar1[lVar4].combinedSamplerName.d.size = (b->combinedSamplerName).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      iVar3 = b->samplerBinding;
      pSVar1[lVar4].textureBinding = b->textureBinding;
      pSVar1[lVar4].samplerBinding = iVar3;
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size +
              1;
      (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }